

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::PrintBackgroundCollectionStats(Recycler *this)

{
  MarkData *pMVar1;
  size_t *psVar2;
  size_t sVar3;
  
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"BgSmall : %5s %6s %10s | BgLarge : %5s %6s %10s | BgMark :%9s %4s %s\n");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  PrintBackgroundCollectionStat(this,(this->collectionStats).backgroundMarkData);
  if ((this->collectionStats).backgroundMarkData[1].markCount != 0) {
    sVar3 = (this->collectionStats).backgroundMarkData[0].rescanObjectCount;
    pMVar1 = (this->collectionStats).backgroundMarkData + 1;
    pMVar1->rescanPageCount =
         pMVar1->rescanPageCount - (this->collectionStats).backgroundMarkData[0].rescanPageCount;
    psVar2 = &(this->collectionStats).backgroundMarkData[1].rescanObjectCount;
    *psVar2 = *psVar2 - sVar3;
    psVar2 = &(this->collectionStats).backgroundMarkData[1].rescanObjectByteCount;
    *psVar2 = *psVar2 - (this->collectionStats).backgroundMarkData[0].rescanObjectByteCount;
    psVar2 = &(this->collectionStats).backgroundMarkData[1].rescanLargePageCount;
    *psVar2 = *psVar2 - (this->collectionStats).backgroundMarkData[0].rescanLargePageCount;
    psVar2 = &(this->collectionStats).backgroundMarkData[1].rescanLargeObjectCount;
    *psVar2 = *psVar2 - (this->collectionStats).backgroundMarkData[0].rescanLargeObjectCount;
    psVar2 = &(this->collectionStats).backgroundMarkData[1].rescanLargeByteCount;
    *psVar2 = *psVar2 - (this->collectionStats).backgroundMarkData[0].rescanLargeByteCount;
    PrintBackgroundCollectionStat(this,(this->collectionStats).backgroundMarkData + 1);
    return;
  }
  return;
}

Assistant:

void
Recycler::PrintBackgroundCollectionStats()
{
#if ENABLE_CONCURRENT_GC
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("BgSmall : %5s %6s %10s | BgLarge : %5s %6s %10s | BgMark :%9s %4s %s\n"),
        _u("Pages"), _u("Count"), _u("Bytes"), _u("Pages"), _u("Count"), _u("Bytes"), _u("Count"), _u("%"), _u("NonLeafBytes   %"));
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));

    this->PrintBackgroundCollectionStat(collectionStats.backgroundMarkData[0]);
    for (uint repeatCount = 1; repeatCount < RecyclerHeuristic::MaxBackgroundRepeatMarkCount; repeatCount++)
    {
        if (collectionStats.backgroundMarkData[repeatCount].markCount == 0)
        {
            break;
        }
        collectionStats.backgroundMarkData[repeatCount].rescanPageCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanPageCount;
        collectionStats.backgroundMarkData[repeatCount].rescanObjectCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanObjectCount;
        collectionStats.backgroundMarkData[repeatCount].rescanObjectByteCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanObjectByteCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargePageCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargePageCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargeObjectCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargeObjectCount;
        collectionStats.backgroundMarkData[repeatCount].rescanLargeByteCount -= collectionStats.backgroundMarkData[repeatCount - 1].rescanLargeByteCount;
        this->PrintBackgroundCollectionStat(collectionStats.backgroundMarkData[repeatCount]);
    }
#endif
}